

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int str_upper(lua_State *L)

{
  int iVar1;
  char *pcVar2;
  lua_State *in_RDI;
  char *s;
  luaL_Buffer b;
  size_t i;
  size_t l;
  undefined7 in_stack_ffffffffffffdfc0;
  undefined1 in_stack_ffffffffffffdfc7;
  undefined8 in_stack_ffffffffffffdfc8;
  lua_State *in_stack_ffffffffffffdfd0;
  undefined1 local_18 [16];
  lua_State *local_8;
  
  local_8 = in_RDI;
  pcVar2 = luaL_checklstring(in_stack_ffffffffffffdfd0,
                             (int)((ulong)in_stack_ffffffffffffdfc8 >> 0x20),
                             (size_t *)CONCAT17(in_stack_ffffffffffffdfc7,in_stack_ffffffffffffdfc0)
                            );
  luaL_buffinit(local_8,(luaL_Buffer *)&stack0xffffffffffffdfd0);
  for (local_18._0_8_ = (GCObject *)0x0; (ulong)local_18._0_8_ < (ulong)local_18._8_8_;
      local_18._0_8_ = (long)(GCObject **)local_18._0_8_ + 1) {
    if ((lua_State *)local_18 <= in_stack_ffffffffffffdfd0) {
      luaL_prepbuffer((luaL_Buffer *)0x11e768);
    }
    iVar1 = toupper((uint)(byte)pcVar2[local_18._0_8_]);
    *(char *)&in_stack_ffffffffffffdfd0->next = (char)iVar1;
    in_stack_ffffffffffffdfd0 = (lua_State *)((long)&in_stack_ffffffffffffdfd0->next + 1);
  }
  luaL_pushresult((luaL_Buffer *)0x11e7c5);
  return 1;
}

Assistant:

static int str_upper(lua_State*L){
size_t l;
size_t i;
luaL_Buffer b;
const char*s=luaL_checklstring(L,1,&l);
luaL_buffinit(L,&b);
for(i=0;i<l;i++)
luaL_addchar(&b,toupper(uchar(s[i])));
luaL_pushresult(&b);
return 1;
}